

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall MsFlash50::extra::extra(extra *this,uint8_t *p)

{
  long lVar1;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  for (lVar1 = 0; ((int)lVar1 != 8 && (p[lVar1] != '\0')); lVar1 = lVar1 + 1) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  this->start = *(uint32_t *)(p + 8);
  this->size = *(uint32_t *)(p + 0xc);
  return;
}

Assistant:

extra(const uint8_t *p)
        {
            name= getstr(p, 8);

            start= get32le(p+8);
            size= get32le(p+12);
        }